

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2131d::QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test::TestBody
          (QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test *this)

{
  _Head_base<0UL,_unodb::qsbr_per_thread_*,_false> _Var1;
  char *pcVar2;
  long **__stat_loc;
  long *local_48;
  _Head_base<0UL,_unodb::qsbr_per_thread_*,_false> local_40;
  __single_object new_qsbr_per_thread;
  _Head_base<0UL,_unodb::qsbr_per_thread_*,_false> local_30;
  thread local_28;
  qsbr_thread second_thread;
  
  pcVar2 = (char *)unodb::test::QSBRTestBase::allocate();
  std::make_unique<unodb::qsbr_per_thread>();
  _Var1._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (qsbr_per_thread *)0x0;
  local_30._M_head_impl = _Var1._M_head_impl;
  new_qsbr_per_thread._M_t.
  super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (__uniq_ptr_data<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>,_true,_true>
        )(__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>)0x0;
  local_48 = (long *)operator_new(0x18);
  *local_48 = (long)&PTR___State_impl_00169658;
  local_30._M_head_impl = (qsbr_per_thread *)0x0;
  local_48[1] = (long)pcVar2;
  local_48[2] = (long)_Var1._M_head_impl;
  __stat_loc = &local_48;
  std::thread::_M_start_thread(&new_qsbr_per_thread,__stat_loc,0);
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_30);
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_40);
  local_28._M_id._M_thread =
       (id)(id)new_qsbr_per_thread._M_t.
               super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>
               ._M_t.
               super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
               .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl;
  new_qsbr_per_thread._M_t.
  super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (__uniq_ptr_data<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>,_true,_true>
        )(__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>)0x0;
  std::thread::~thread((thread *)&new_qsbr_per_thread);
  unodb::detail::thread_sync::wait((thread_sync *)unodb::detail::thread_syncs,__stat_loc);
  unodb::test::must_not_allocate<unodb::test::QSBRTestBase::join(unodb::qsbr_thread&)::_lambda()_1_>
            ((qsbr_thread *)&local_28);
  *pcVar2 = unodb::test::QSBRTestBase::touch_memory(char*,char)::value;
  unodb::test::QSBRTestBase::touch_memory(char*,char)::value =
       unodb::test::QSBRTestBase::touch_memory(char*,char)::value + '\x01';
  unodb::test::QSBRTestBase::quiescent();
  std::thread::~thread(&local_28);
  return;
}

Assistant:

UNODB_TEST_F(QSBR, TwoThreadsDeallocateBeforeQuittingPointerStaysLive) {
  auto *ptr = static_cast<char *>(allocate());

  unodb::qsbr_thread second_thread{[ptr] {
    qsbr_deallocate(ptr);
    thread_syncs[0].notify();  // 1 ->
  }};

  thread_syncs[0].wait();  // 1 <-
  join(second_thread);

  touch_memory(ptr);

  quiescent();
}